

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildLong1Float1
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot)

{
  code *pcVar1;
  bool bVar2;
  RegOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  undefined4 *puVar3;
  RegOpnd *this_00;
  Instr *pIVar4;
  IRType IVar5;
  OpCode opcode;
  undefined6 in_register_00000032;
  
  src1Opnd = BuildSrcOpnd(this,src1RegSlot,TyFloat32);
  switch((int)CONCAT62(in_register_00000032,newOpcode)) {
  case 0x110:
    IVar5 = TyInt64;
    break;
  case 0x111:
    IVar5 = TyUint64;
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0xd41,"((0))","(0)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    opcode = Nop;
    bVar2 = false;
    dstOpnd = (RegOpnd *)0x0;
    goto LAB_005031d9;
  case 0x118:
    IVar5 = TyInt64;
    goto LAB_0050316a;
  case 0x119:
    IVar5 = TyUint64;
LAB_0050316a:
    dstOpnd = BuildDstOpnd(this,dstRegSlot,IVar5);
    opcode = Conv_Prim_Sat;
    bVar2 = false;
    goto LAB_005031d9;
  }
  dstOpnd = BuildDstOpnd(this,dstRegSlot,IVar5);
  opcode = Conv_Prim;
  bVar2 = true;
LAB_005031d9:
  this_00 = src1Opnd;
  if (bVar2) {
    this_00 = IR::RegOpnd::New((src1Opnd->super_Opnd).m_type,this->m_func);
    IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x108);
    pIVar4 = IR::Instr::New(TrapIfTruncOverflow,&this_00->super_Opnd,&src1Opnd->super_Opnd,
                            this->m_func);
    AddInstr(this,pIVar4,offset);
    dstOpnd->field_0x18 = dstOpnd->field_0x18 | 4;
  }
  pIVar4 = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&this_00->super_Opnd,this->m_func);
  AddInstr(this,pIVar4,offset);
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildLong1Float1(Js::OpCodeAsmJs newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot src1RegSlot)
{
    IR::RegOpnd * srcOpnd = BuildSrcOpnd(src1RegSlot, TyFloat32);
    IR::RegOpnd * dstOpnd = nullptr;
    Js::OpCode op = Js::OpCode::Nop;
    bool trapping = false;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::Conv_Check_FTL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
        op = Js::OpCode::Conv_Prim;
        trapping = true;
        break;
    case Js::OpCodeAsmJs::Conv_Check_FTUL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint64);
        op = Js::OpCode::Conv_Prim;
        trapping = true;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyInt64);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    case Js::OpCodeAsmJs::Conv_Sat_FTUL:
        dstOpnd = BuildDstOpnd(dstRegSlot, TyUint64);
        op = Js::OpCode::Conv_Prim_Sat;
        break;
    default:
        Assume(UNREACHED);
    }

    if (trapping)
    {
        IR::RegOpnd* tmpDst = IR::RegOpnd::New(srcOpnd->GetType(), m_func);
        tmpDst->SetValueType(ValueType::Float);
        AddInstr(IR::Instr::New(Js::OpCode::TrapIfTruncOverflow, tmpDst, srcOpnd, m_func), offset);
        dstOpnd->m_dontDeadStore = true;
        srcOpnd = tmpDst;
    }
    IR::Instr * instr = IR::Instr::New(op, dstOpnd, srcOpnd, m_func);
    AddInstr(instr, offset);
}